

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O1

void __thiscall
QGraphicsProxyWidget::contextMenuEvent
          (QGraphicsProxyWidget *this,QGraphicsSceneContextMenuEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  Reason RVar3;
  KeyboardModifiers KVar4;
  QWidget *this_01;
  Data *pDVar5;
  QWidget *pQVar6;
  ulong uVar7;
  undefined4 extraout_EDX;
  uint uVar8;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  QPoint globalPos;
  QContextMenuEvent contextMenuEvent;
  ulong local_98;
  QPoint local_90;
  QPointF local_88;
  QPoint local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (event != (QGraphicsSceneContextMenuEvent *)0x0) {
    this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
    pDVar5 = (this_00->widget).wp.d;
    if ((((pDVar5 != (Data *)0x0) && (*(int *)(pDVar5 + 4) != 0)) &&
        ((this_00->widget).wp.value != (QObject *)0x0)) &&
       (((*(byte *)(*(long *)((this_00->widget).wp.value + 0x20) + 9) & 0x80) != 0 &&
        (bVar2 = QGraphicsItem::hasFocus((QGraphicsItem *)(this + 0x10)), bVar2)))) {
      local_88.yp._0_4_ = 0xffffffff;
      local_88.xp = -NAN;
      local_88.yp._4_4_ = 0xffffffff;
      local_88 = QGraphicsSceneContextMenuEvent::pos(event);
      auVar10 = _DAT_0066f5b0 & (undefined1  [16])local_88 | _DAT_0066f5c0;
      auVar11._0_8_ = auVar10._0_8_ + local_88.xp;
      auVar11._8_8_ = auVar10._8_8_ + local_88.yp;
      auVar10 = minpd(_DAT_0066f5d0,auVar11);
      auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
      auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
      uVar7 = (ulong)(uint)(int)auVar10._0_8_;
      uVar8 = movmskpd(extraout_EDX,auVar12);
      uVar9 = (ulong)(uint)(int)auVar10._8_8_ << 0x20;
      if ((uVar8 & 2) == 0) {
        uVar9 = 0x8000000000000000;
      }
      if ((uVar8 & 1) == 0) {
        uVar7 = 0x80000000;
      }
      local_78 = (QPoint)(uVar7 | uVar9);
      this_01 = QWidget::childAt((QWidget *)(this_00->widget).wp.value,&local_78);
      if (this_01 == (QWidget *)0x0) {
        pDVar5 = (Data *)0x0;
      }
      else {
        pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&this_01->super_QObject);
      }
      if (pDVar5 == (Data *)0x0) {
        bVar2 = false;
      }
      else {
        bVar2 = this_01 != (QWidget *)0x0 && *(int *)(pDVar5 + 4) != 0;
      }
      pDVar1 = pDVar5;
      if (!bVar2) {
        pDVar1 = (this_00->widget).wp.d;
        this_01 = (QWidget *)(this_00->widget).wp.value;
      }
      if (pDVar1 == (Data *)0x0) {
        pQVar6 = (QWidget *)0x0;
      }
      else {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + 1;
        UNLOCK();
        pQVar6 = (QWidget *)0x0;
        if (*(int *)(pDVar1 + 4) != 0) {
          pQVar6 = this_01;
        }
      }
      local_88 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_88,pQVar6);
      auVar10._0_8_ =
           (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp;
      auVar10._8_8_ =
           (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.yp;
      auVar10 = minpd(_DAT_0066f5d0,auVar10);
      auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
      auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
      uVar7 = (ulong)(uint)(int)auVar10._0_8_;
      uVar8 = movmskpd(extraout_EDX_00,auVar13);
      uVar9 = (ulong)(uint)(int)auVar10._8_8_ << 0x20;
      if ((uVar8 & 2) == 0) {
        uVar9 = 0x8000000000000000;
      }
      local_90 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      if ((uVar8 & 1) == 0) {
        uVar7 = 0x80000000;
      }
      local_78 = (QPoint)(uVar7 | uVar9);
      local_90 = QWidget::mapToGlobal(this_01,&local_78);
      if (pDVar1 == (Data *)0x0) {
        pQVar6 = (QWidget *)0x0;
      }
      else {
        pQVar6 = (QWidget *)0x0;
        if (*(int *)(pDVar1 + 4) != 0) {
          pQVar6 = this_01;
        }
      }
      while ((pQVar6 != (QWidget *)0x0 &&
             (((pQVar6->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 0x20000000) == 0))) {
        pQVar6 = *(QWidget **)(*(long *)&pQVar6->field_0x8 + 0x10);
      }
      if (pQVar6 != (QWidget *)0x0) {
        local_90 = QGraphicsSceneContextMenuEvent::screenPos(event);
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      RVar3 = QGraphicsSceneContextMenuEvent::reason(event);
      auVar14._0_8_ =
           (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp;
      auVar14._8_8_ =
           (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.yp;
      auVar10 = minpd(_DAT_0066f5d0,auVar14);
      auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
      auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
      uVar8 = movmskpd(extraout_EDX_01,auVar15);
      uVar7 = 0x8000000000000000;
      if ((uVar8 & 2) != 0) {
        uVar7 = (ulong)(uint)(int)auVar10._8_8_ << 0x20;
      }
      local_98 = 0x80000000;
      if ((uVar8 & 1) != 0) {
        local_98 = (ulong)(uint)(int)auVar10._0_8_;
      }
      local_98 = local_98 | uVar7;
      KVar4 = QGraphicsSceneContextMenuEvent::modifiers(event);
      QContextMenuEvent::QContextMenuEvent
                ((QContextMenuEvent *)&local_78,RVar3,&local_98,&local_90,
                 KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                 super_QFlagsStorage<Qt::KeyboardModifier>.i);
      puStack_60 = (undefined1 *)QGraphicsSceneEvent::timestamp(&event->super_QGraphicsSceneEvent);
      if (pDVar1 == (Data *)0x0) {
        this_01 = (QWidget *)0x0;
      }
      else if (*(int *)(pDVar1 + 4) == 0) {
        this_01 = (QWidget *)0x0;
      }
      QCoreApplication::sendEvent(&this_01->super_QObject,(QEvent *)&local_78);
      (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,uStack_70._4_1_);
      QContextMenuEvent::~QContextMenuEvent((QContextMenuEvent *)&local_78);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
      }
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar5 = *(int *)pDVar5 + -1;
        UNLOCK();
        if (*(int *)pDVar5 == 0) {
          operator_delete(pDVar5);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::contextMenuEvent(QGraphicsSceneContextMenuEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!event || !d->widget || !d->widget->isVisible() || !hasFocus())
        return;

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = d->widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : d->widget;

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    QPoint globalPos = receiver->mapToGlobal(pos.toPoint());
    //If the receiver by-pass the proxy its popups
    //will be top level QWidgets therefore they need
    //the screen position. mapToGlobal expect the widget to
    //have proper coordinates in regards of the windowing system
    //but it's not true because the widget is embedded.
    if (bypassGraphicsProxyWidget(receiver))
        globalPos = event->screenPos();

    // Send mouse event. ### Doesn't propagate the event.
    QContextMenuEvent contextMenuEvent(QContextMenuEvent::Reason(event->reason()),
                                       pos.toPoint(), globalPos, event->modifiers());
    contextMenuEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(receiver, &contextMenuEvent);

    event->setAccepted(contextMenuEvent.isAccepted());
}